

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  size_type *psVar1;
  pointer pSVar2;
  _Alloc_hider _Var3;
  ostream *poVar4;
  size_t sVar5;
  pointer pSVar6;
  undefined1 local_58 [8];
  SourceLineInfo lineInfo;
  Colour colourGuard_1;
  
  if ((this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    printOpenHeader(this,&((this->super_StreamingReporterBase).currentTestCaseInfo.
                           super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    pSVar6 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 3) *
                   0x4ec4ec4ec4ec4ec5)) {
      local_58 = (undefined1  [8])((ulong)local_58 & 0xffffffffffffff00);
      Colour::use(Headers);
      pSVar6 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while (pSVar6 = pSVar6 + 1, pSVar6 != pSVar2) {
        printHeaderString(this,&pSVar6->name,2);
      }
      Colour::use(None);
      pSVar6 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    psVar1 = &lineInfo.file._M_string_length;
    _Var3._M_p = (pSVar6->lineInfo).file._M_dataplus._M_p;
    local_58 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,_Var3._M_p,_Var3._M_p + (pSVar6->lineInfo).file._M_string_length);
    lineInfo.file.field_2._8_8_ = (pSVar6->lineInfo).line;
    if (lineInfo.file._M_dataplus._M_p != (pointer)0x0) {
      poVar4 = (this->super_StreamingReporterBase).stream;
      if (getLineOfChars<(char)45>()::line == '\0') {
        uRam000000000016c5b0 = 0x2d2d2d2d2d2d2d;
        uRam000000000016c5b7 = 0x2d2d2d2d2d2d2d2d;
        _DAT_0016c5a0 = 0x2d2d2d2d2d2d2d2d;
        uRam000000000016c5a8 = 0x2d2d2d2d2d2d2d;
        DAT_0016c5af = 0x2d;
        _DAT_0016c590 = 0x2d2d2d2d2d2d2d2d;
        uRam000000000016c598 = 0x2d2d2d2d2d2d2d2d;
        _DAT_0016c580 = 0x2d2d2d2d2d2d2d2d;
        uRam000000000016c588 = 0x2d2d2d2d2d2d2d2d;
        _line = 0x2d2d2d2d2d2d2d2d;
        uRam000000000016c578 = 0x2d2d2d2d2d2d2d2d;
        DAT_0016c5bf = 0;
      }
      sVar5 = strlen(&getLineOfChars<(char)45>()::line);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,&getLineOfChars<(char)45>()::line,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      lineInfo.line._7_1_ = 0;
      Colour::use(FileName);
      poVar4 = (this->super_StreamingReporterBase).stream;
      operator<<(poVar4,(SourceLineInfo *)local_58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      Colour::use(None);
    }
    poVar4 = (this->super_StreamingReporterBase).stream;
    if (getLineOfChars<(char)46>()::line == '\0') {
      uRam000000000016c600 = 0x2e2e2e2e2e2e2e;
      uRam000000000016c607 = 0x2e2e2e2e2e2e2e2e;
      _DAT_0016c5f0 = 0x2e2e2e2e2e2e2e2e;
      uRam000000000016c5f8 = 0x2e2e2e2e2e2e2e;
      DAT_0016c5ff = 0x2e;
      _DAT_0016c5e0 = 0x2e2e2e2e2e2e2e2e;
      uRam000000000016c5e8 = 0x2e2e2e2e2e2e2e2e;
      _DAT_0016c5d0 = 0x2e2e2e2e2e2e2e2e;
      uRam000000000016c5d8 = 0x2e2e2e2e2e2e2e2e;
      _line = 0x2e2e2e2e2e2e2e2e;
      uRam000000000016c5c8 = 0x2e2e2e2e2e2e2e2e;
      DAT_0016c60f = 0;
    }
    sVar5 = strlen(&getLineOfChars<(char)46>()::line);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,&getLineOfChars<(char)46>()::line,sVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_58 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_58,lineInfo.file._M_string_length + 1);
    }
    return;
  }
  __assert_fail("!m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/diorahman[P]anwari/tests/../deps/catch/catch.hpp"
                ,0x262d,"void Catch::ConsoleReporter::printTestCaseAndSectionHeader()");
}

Assistant:

void printTestCaseAndSectionHeader() {
            assert( !m_sectionStack.empty() );
            printOpenHeader( currentTestCaseInfo->name );

            if( m_sectionStack.size() > 1 ) {
                Colour colourGuard( Colour::Headers );

                std::vector<SectionInfo>::const_iterator
                    it = m_sectionStack.begin()+1, // Skip first section (test case)
                    itEnd = m_sectionStack.end();
                for( ; it != itEnd; ++it )
                    printHeaderString( it->name, 2 );
            }

            SourceLineInfo lineInfo = m_sectionStack.front().lineInfo;

            if( !lineInfo.empty() ){
                stream << getLineOfChars<'-'>() << "\n";
                Colour colourGuard( Colour::FileName );
                stream << lineInfo << "\n";
            }
            stream << getLineOfChars<'.'>() << "\n" << std::endl;
        }